

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  pointer ppcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  type pcVar9;
  type pcVar10;
  size_type sVar11;
  size_type sVar12;
  ulong uVar13;
  pointer ppcVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  char *pcVar18;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *pdVar19;
  ulong uVar20;
  int i;
  int iVar21;
  float fVar22;
  pair<unsigned_long,_unsigned_long> pVar23;
  Settings __tmp;
  pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  p_2;
  pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  p;
  size_type expected_buckets;
  TypeParam other_ht;
  hasher hasher;
  KeyInfo __tmp_1;
  pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_258;
  float local_238;
  float fStack_234;
  ulong uStack_230;
  key_equal local_220;
  undefined1 local_210 [8];
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_208;
  pointer ppcStack_200;
  pointer local_1f8;
  size_type sStack_1f0;
  float local_1e8;
  float fStack_1e4;
  ulong uStack_1e0;
  Hasher local_1d8;
  undefined4 uStack_1cc;
  type local_1c8;
  type pcStack_1c0;
  size_type local_1b8;
  size_type sStack_1b0;
  ulong local_1a8;
  pointer local_190;
  undefined1 local_188 [8];
  pointer local_180;
  pointer ppcStack_178;
  ulong local_170;
  ulong uStack_168;
  float local_160;
  float fStack_15c;
  undefined8 uStack_158;
  Hasher local_150;
  undefined4 uStack_144;
  char *local_140;
  type pcStack_138;
  size_type local_130;
  size_type sStack_128;
  ulong local_120;
  pointer local_108;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_f8;
  key_equal local_70;
  hasher local_64 [4];
  
  local_64[0].id_ = 1;
  local_64[0].num_hashes_ = 0;
  local_64[0].num_compares_ = 0;
  local_188 = (undefined1  [8])((ulong)local_188 & 0xffffffff00000000);
  local_180 = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet(&local_f8,200,local_64,local_64,(allocator_type *)local_188);
  pcVar18 = UniqueObjectHelper<char_const*>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(char **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.key_info + 0x10) = pcVar18;
  pdVar19 = (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)UniqueObjectHelper<char_const*>(2);
  this_01 = &local_f8.
             super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_01->rep);
  local_f8.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_
       = true;
  iVar21 = 3;
  local_f8.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey = (type)pdVar19;
  do {
    local_210 = (undefined1  [8])UniqueObjectHelper<char_const*>(iVar21);
    google::
    dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<char_const*const&,char_const*const&>
              ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)local_188,
               (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                *)this_00,(char **)local_210,(char **)local_210);
    iVar21 = iVar21 + 1;
  } while (iVar21 != 2000);
  local_188 = (undefined1  [8])UniqueObjectHelper<char_const*>(1000);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_188);
  local_210 = (undefined1  [8])UniqueObjectHelper<char_const*>(0x7d1);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_01->rep,1);
  google::
  dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<char_const*const&,char_const*const&>
            ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_188,
             (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)this_01,(char **)local_210,(char **)local_210);
  local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_f8.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_buckets;
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::swap(&this_00->rep,&this_01->rep);
  local_210 = (undefined1  [8])UniqueObjectHelper<char_const*>(2);
  local_258.first.ht =
       *(dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.key_info + 0x10);
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_188,"this->UniqueKey(2)","this->ht_.deleted_key()",(char **)local_210
             ,(char **)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1db,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210 = (undefined1  [8])UniqueObjectHelper<char_const*>(1);
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_f8.
          super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.key_info.delkey;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_188,"this->UniqueKey(1)","other_ht.deleted_key()",(char **)local_210,
             (char **)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1dc,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210._0_4_ = 1;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,
                   (this_00->rep).settings.
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"1","this->ht_.hash_funct().id()",(int *)local_210,
             (int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1de,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffff00000000);
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,
                   local_f8.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings.
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"0","other_ht.hash_funct().id()",(int *)local_210,
             (int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1df,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210._0_4_ = 1;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"1","this->ht_.key_eq().id()",(int *)local_210,(int *)&local_258)
  ;
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e1,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffff00000000);
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,
                   local_f8.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"0","other_ht.key_eq().id()",(int *)local_210,(int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e2,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210 = (undefined1  [8])
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_buckets;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_188,"expected_buckets","this->ht_.bucket_count()",
             (unsigned_long *)&local_100,(unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e4,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210 = (undefined1  [8])
              local_f8.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_buckets;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,200);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)local_188,"other_ht.bucket_count()","200u",(unsigned_long *)local_210,
             (uint *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e5,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,1);
  local_210 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","this->ht_.size()",(uint *)&local_258,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e7,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,0x7cc);
  local_210 = (undefined1  [8])
              (local_f8.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              local_f8.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1996u","other_ht.size()",(uint *)&local_258,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e8,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_220._0_8_ = (ulong)(uint)local_220.num_hashes_ << 0x20;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x6f);
  pVar23 = google::
           dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_258);
  local_210._1_7_ = 0;
  local_210[0] = pVar23.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_220,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ea,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_220.id_ = 1;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x6f);
  pVar23 = google::
           dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_01,(char **)&local_258);
  local_210._1_7_ = 0;
  local_210[0] = pVar23.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","other_ht.count(this->UniqueKey(111))",(uint *)&local_220,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1eb,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_220.id_ = 1;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x7d1);
  pVar23 = google::
           dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_258);
  local_210._1_7_ = 0;
  local_210[0] = pVar23.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","this->ht_.count(this->UniqueKey(2001))",(uint *)&local_220,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ec,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_220._0_8_ = local_220._0_8_ & 0xffffffff00000000;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x7d1);
  pVar23 = google::
           dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_01,(char **)&local_258);
  local_210._1_7_ = 0;
  local_210[0] = pVar23.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","other_ht.count(this->UniqueKey(2001))",(uint *)&local_220,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ed,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_220._0_8_ = local_220._0_8_ & 0xffffffff00000000;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(1000);
  pVar23 = google::
           dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_258);
  local_210._1_7_ = 0;
  local_210[0] = pVar23.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","this->ht_.count(this->UniqueKey(1000))",(uint *)&local_220,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ee,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_220._0_8_ = local_220._0_8_ & 0xffffffff00000000;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(1000);
  pVar23 = google::
           dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_01,(char **)&local_258);
  local_210._1_7_ = 0;
  local_210[0] = pVar23.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","other_ht.count(this->UniqueKey(1000))",(uint *)&local_220,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ef,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::swap(&this_00->rep,&this_01->rep);
  local_210 = (undefined1  [8])UniqueObjectHelper<char_const*>(1);
  local_258.first.ht =
       *(dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.key_info + 0x10);
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_188,"this->UniqueKey(1)","this->ht_.deleted_key()",(char **)local_210
             ,(char **)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fc,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210 = (undefined1  [8])UniqueObjectHelper<char_const*>(2);
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_f8.
          super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.key_info.delkey;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_188,"this->UniqueKey(2)","other_ht.deleted_key()",(char **)local_210,
             (char **)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fd,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffff00000000);
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,
                   (this_00->rep).settings.
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"0","this->ht_.hash_funct().id()",(int *)local_210,
             (int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fe,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_210._0_4_ = 1;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,
                   local_f8.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings.
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"1","other_ht.hash_funct().id()",(int *)local_210,
             (int *)&local_258);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ff,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,0x7cc);
  local_210 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1996u","this->ht_.size()",(uint *)&local_258,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x200,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_258.first.ht._4_4_,1);
  local_210 = (undefined1  [8])
              (local_f8.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              local_f8.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","other_ht.size()",(uint *)&local_258,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x201,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_220.id_ = 1;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x6f);
  pVar23 = google::
           dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_258);
  local_210._1_7_ = 0;
  local_210[0] = pVar23.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_220,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x202,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_220._0_8_ = local_220._0_8_ & 0xffffffff00000000;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x6f);
  pVar23 = google::
           dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_01,(char **)&local_258);
  local_210._1_7_ = 0;
  local_210[0] = pVar23.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","other_ht.count(this->UniqueKey(111))",(uint *)&local_220,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (pointer)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x203,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  ppcVar1 = local_180;
  if (local_180 != (pointer)0x0) {
    if ((pointer)*local_180 != local_180 + 2) {
      operator_delete(*local_180);
    }
    operator_delete(ppcVar1);
  }
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_258.first.pos = (pointer)((ulong)local_258.first.pos._4_4_ << 0x20);
  local_220._0_8_ = (char *)0x0;
  local_220.num_compares_ = 0;
  local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffff00000000);
  local_208 = (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_188,0,(hasher *)&local_258,&local_220,(allocator_type *)local_210);
  pcVar18 = UniqueObjectHelper<char_const*>(1);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_180);
  uStack_158._0_3_ = CONCAT12(true,(undefined2)uStack_158);
  iVar21 = 2;
  local_140 = pcVar18;
  do {
    local_258.first.ht =
         (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<char_const*>(iVar21);
    google::
    dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_180,1);
    google::
    dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<char_const*const&,char_const*const&>
              ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)local_210,
               (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                *)&local_180,(char **)&local_258,(char **)&local_258);
    iVar21 = iVar21 + 1;
  } while (iVar21 != 10000);
  local_220._0_8_ = (char *)0x0;
  local_220.num_compares_ = 0;
  local_70.id_ = 0;
  local_70.num_hashes_ = 0;
  local_70.num_compares_ = 0;
  local_258.first.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_258.first.ht & 0xffffffff00000000);
  local_258.first.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_210,0,&local_220,&local_70,(allocator_type *)&local_258);
  uVar17 = local_120;
  uVar15 = _local_160;
  ppcVar14 = local_190;
  uVar13 = local_1a8;
  sVar12 = sStack_1b0;
  sVar11 = local_1b8;
  pcVar10 = pcStack_1c0;
  pcVar9 = local_1c8;
  uVar7 = stack0xfffffffffffffe30;
  uVar5 = local_1d8._0_8_;
  uVar4 = uStack_1e0;
  uVar2 = _local_1e8;
  ppcVar1 = ppcStack_200;
  pdVar19 = local_208;
  local_238 = local_1e8;
  fStack_234 = fStack_1e4;
  uStack_230 = uStack_1e0;
  local_258.first.end = local_1f8;
  local_258._24_8_ = sStack_1f0;
  local_258.first.ht = local_208;
  local_258.first.pos = ppcStack_200;
  local_1e8 = local_160;
  fStack_1e4 = fStack_15c;
  uVar3 = _local_1e8;
  local_208 = (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)local_180;
  ppcStack_200 = ppcStack_178;
  local_1e8 = (float)uVar2;
  fStack_1e4 = SUB84(uVar2,4);
  local_160 = local_1e8;
  fStack_15c = fStack_1e4;
  uVar16 = _local_160;
  local_180 = (pointer)pdVar19;
  ppcStack_178 = ppcVar1;
  local_1c8 = local_140;
  pcStack_1c0 = pcStack_138;
  local_1d8.id_ = local_150.id_;
  local_1d8.num_hashes_ = local_150.num_hashes_;
  uVar6 = local_1d8._0_8_;
  local_1d8.num_compares_ = local_150.num_compares_;
  uStack_1cc = uStack_144;
  uVar8 = stack0xfffffffffffffe30;
  local_140 = pcVar9;
  pcStack_138 = pcVar10;
  local_1d8.id_ = (int)uVar5;
  local_1d8.num_hashes_ = SUB84(uVar5,4);
  local_150.id_ = local_1d8.id_;
  local_150.num_hashes_ = local_1d8.num_hashes_;
  local_1d8.num_compares_ = (int)uVar7;
  uStack_1cc = SUB84(uVar7,4);
  local_150.num_compares_ = local_1d8.num_compares_;
  uStack_144 = uStack_1cc;
  local_1b8 = local_130;
  sStack_1b0 = sStack_128;
  local_130 = sVar11;
  sStack_128 = sVar12;
  local_1a8 = local_120;
  local_120 = uVar13;
  local_190 = local_108;
  local_108 = ppcVar14;
  local_1e8 = (float)uVar15;
  local_1e8 = local_1e8 * (float)uVar17;
  uVar20 = (ulong)local_1e8;
  local_1f8 = (pointer)((long)(local_1e8 - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20);
  fStack_1e4 = SUB84(uVar15,4);
  fStack_1e4 = (float)uVar17 * fStack_1e4;
  sStack_1f0 = (size_type)fStack_1e4;
  sStack_1f0 = (long)(fStack_1e4 - 9.223372e+18) & (long)sStack_1f0 >> 0x3f | sStack_1f0;
  uStack_1e0 = uStack_158 & 0xffffffffffffff00;
  fVar22 = (float)uVar13;
  local_160 = (float)uVar2;
  local_160 = local_160 * fVar22;
  local_170 = (ulong)local_160;
  local_170 = (long)(local_160 - 9.223372e+18) & (long)local_170 >> 0x3f | local_170;
  fStack_15c = SUB84(uVar2,4);
  fVar22 = fVar22 * fStack_15c;
  uStack_168 = (ulong)fVar22;
  uStack_168 = (long)(fVar22 - 9.223372e+18) & (long)uStack_168 >> 0x3f | uStack_168;
  uStack_158 = uVar4 & 0xffffffffffffff00;
  _local_1e8 = uVar3;
  local_1d8._0_8_ = uVar6;
  unique0x10002879 = uVar8;
  _local_160 = uVar16;
  pcVar18 = UniqueObjectHelper<char_const*>(1);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_180);
  uStack_158._2_1_ = true;
  iVar21 = 2;
  local_140 = pcVar18;
  do {
    local_220._0_8_ = UniqueObjectHelper<char_const*>(iVar21);
    google::
    dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_180,1);
    google::
    dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<char_const*const&,char_const*const&>
              (&local_258,
               (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                *)&local_180,(char **)&local_220,(char **)&local_220);
    iVar21 = iVar21 + 1;
  } while (iVar21 != 10000);
  local_210 = (undefined1  [8])&PTR__BaseHashtableInterface_00c195f8;
  if (local_190 != (pointer)0x0) {
    free(local_190);
  }
  local_188 = (undefined1  [8])&PTR__BaseHashtableInterface_00c195f8;
  if (local_108 != (pointer)0x0) {
    free(local_108);
  }
  local_f8.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c195f8;
  if (local_f8.
      super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_f8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}